

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_geo_t * golf_entity_get_geo(golf_entity_t *entity)

{
  golf_entity_type_t gVar1;
  golf_entity_t *entity_local;
  
  gVar1 = entity->type;
  if (HOLE_ENTITY < gVar1) {
    if (gVar1 == GEO_ENTITY) {
      return &(entity->field_4).geo.geo;
    }
    if (gVar1 == WATER_ENTITY) {
      return (golf_geo_t *)&(entity->field_4).model.movement;
    }
    if (2 < gVar1 - GROUP_ENTITY) {
      return (golf_geo_t *)0x0;
    }
  }
  return (golf_geo_t *)0x0;
}

Assistant:

golf_geo_t *golf_entity_get_geo(golf_entity_t *entity) {
    switch (entity->type) {
        case MODEL_ENTITY: 
        case HOLE_ENTITY: 
        case BALL_START_ENTITY: 
        case BEGIN_ANIMATION_ENTITY:
        case CAMERA_ZONE_ENTITY:
        case GROUP_ENTITY: {
            return NULL;
        }
        case GEO_ENTITY: {
            return &entity->geo.geo;
        }
        case WATER_ENTITY: {
            return &entity->water.geo;
        }
    }
    return NULL;
}